

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void appendAllPathElements(DbPath *pPath,char *zPath)

{
  long lVar1;
  bool bVar2;
  int local_20;
  int local_1c;
  int j;
  int i;
  char *zPath_local;
  DbPath *pPath_local;
  
  local_1c = 0;
  local_20 = 0;
  do {
    while( true ) {
      bVar2 = false;
      if (zPath[local_1c] != '\0') {
        bVar2 = zPath[local_1c] != '/';
      }
      if (!bVar2) break;
      local_1c = local_1c + 1;
    }
    if (local_20 < local_1c) {
      appendOnePathElement(pPath,zPath + local_20,local_1c - local_20);
    }
    local_20 = local_1c + 1;
    lVar1 = (long)local_1c;
    local_1c = local_1c + 1;
  } while (zPath[lVar1] != '\0');
  return;
}

Assistant:

static void appendAllPathElements(
  DbPath *pPath,       /* Path under construction, to which to append zName */
  const char *zPath    /* Path to append to pPath.  Is zero-terminated */
){
  int i = 0;
  int j = 0;
  do{
    while( zPath[i] && zPath[i]!='/' ){ i++; }
    if( i>j ){
      appendOnePathElement(pPath, &zPath[j], i-j);
    }
    j = i+1;
  }while( zPath[i++] );
}